

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O3

bool __thiscall irr::scene::CB3DMeshFileLoader::load(CB3DMeshFileLoader *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  iterator iVar2;
  pointer pSVar3;
  pointer pSVar4;
  pointer piVar5;
  pointer piVar6;
  double dVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar11;
  ulong uVar12;
  undefined4 extraout_var_02;
  void *pvVar13;
  void *__src;
  undefined4 extraout_XMM0_Da;
  c8 extraout_XMM0_Da_00 [4];
  c8 acVar14 [4];
  undefined4 extraout_XMM0_Db;
  int extraout_XMM0_Db_00;
  SB3dChunkHeader header;
  s32 fileVersion;
  c8 local_60 [4];
  int local_5c;
  vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_> local_58;
  undefined1 local_34 [4];
  
  pvVar13 = *(void **)&(this->super_IMeshLoader).field_0x8;
  lVar11 = *(long *)&(this->super_IMeshLoader).field_0x18;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x8 = 0;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
  *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
  if (pvVar13 != (void *)0x0) {
    operator_delete(pvVar13,lVar11 - (long)pvVar13);
  }
  this->field_0x20 = 1;
  this->NormalsInFile = false;
  this->HasVertexColors = false;
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_60,8);
  if (local_60 == (c8  [4])0x44334242) {
    this_00 = &(this->super_IMeshLoader).field_0x8;
    iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)(CONCAT44(extraout_var,iVar9) + -8);
    iVar9 = 0;
    if (0 < local_5c) {
      iVar9 = local_5c;
    }
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9 + 8,local_60);
    iVar2._M_current = *(SB3dChunk **)&(this->super_IMeshLoader).field_0x10;
    if (iVar2._M_current == *(SB3dChunk **)&(this->super_IMeshLoader).field_0x18) {
      ::std::vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>::
      _M_realloc_insert<irr::scene::SB3dChunk>
                ((vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_> *)this_00,
                 iVar2,(SB3dChunk *)&local_58);
    }
    else {
      *&(iVar2._M_current)->name = local_60;
      (iVar2._M_current)->length = iVar9 + 8;
      (iVar2._M_current)->startposition =
           (long)local_58.
                 super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = &(this->super_IMeshLoader).field_0x10;
      *(long *)puVar1 = *(long *)puVar1 + 0x10;
    }
    this->field_0x20 = 0;
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_34,4);
    lVar11 = *(long *)&(this->super_IMeshLoader).field_0x10;
    iVar9 = *(int *)(lVar11 + -0xc);
    lVar11 = *(long *)(lVar11 + -8);
    iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
    if (CONCAT44(extraout_var_00,iVar10) < iVar9 + lVar11) {
      do {
        (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,local_60,8);
        iVar9 = (*this->B3DFile->_vptr_IReadFile[3])();
        local_58.
        super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)(CONCAT44(extraout_var_01,iVar9) + -8);
        iVar9 = local_5c;
        if (local_5c < 1) {
          iVar9 = 0;
        }
        iVar9 = iVar9 + 8;
        local_58.
        super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(iVar9,local_60);
        iVar2._M_current = *(SB3dChunk **)&(this->super_IMeshLoader).field_0x10;
        if (iVar2._M_current == *(SB3dChunk **)&(this->super_IMeshLoader).field_0x18) {
          ::std::vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>::
          _M_realloc_insert<irr::scene::SB3dChunk>
                    ((vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_> *)
                     this_00,iVar2,(SB3dChunk *)&local_58);
          lVar11 = *(long *)&(this->super_IMeshLoader).field_0x10;
          acVar14 = extraout_XMM0_Da_00;
          iVar9 = extraout_XMM0_Db_00;
        }
        else {
          *&(iVar2._M_current)->name = local_60;
          (iVar2._M_current)->length = iVar9;
          (iVar2._M_current)->startposition =
               (long)local_58.
                     super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          lVar11 = *(long *)&(this->super_IMeshLoader).field_0x10 + 0x10;
          *(long *)&(this->super_IMeshLoader).field_0x10 = lVar11;
          acVar14 = local_60;
        }
        this->field_0x20 = 0;
        iVar10 = *(int *)(lVar11 + -0x10);
        if (iVar10 == 0x45444f4e) {
          bVar8 = readChunkNODE(this,(SJoint *)0x0);
          if (!bVar8) {
            return false;
          }
        }
        else if (iVar10 == 0x53555242) {
          readChunkBRUS(this);
        }
        else if (iVar10 == 0x53584554) {
          readChunkTEXS(this);
        }
        else {
          dVar7 = os::Printer::log((Printer *)"Unknown chunk found in mesh base - skipping",
                                   (double)CONCAT44(iVar9,acVar14));
          lVar11 = *(long *)&(this->super_IMeshLoader).field_0x10;
          iVar9 = (*this->B3DFile->_vptr_IReadFile[1])
                            (SUB84(dVar7,0),this->B3DFile,
                             (long)*(int *)(lVar11 + -0xc) + *(long *)(lVar11 + -8),0);
          if ((char)iVar9 == '\0') {
            return false;
          }
          lVar11 = *(long *)&(this->super_IMeshLoader).field_0x8;
          pvVar13 = *(void **)&(this->super_IMeshLoader).field_0x10;
          uVar12 = (long)pvVar13 + (0xffffffff0 - lVar11) & 0xffffffff0;
          __src = (void *)(lVar11 + uVar12 + 0x10);
          if (__src != pvVar13) {
            memmove((void *)(lVar11 + uVar12),__src,(long)pvVar13 - (long)__src);
            pvVar13 = *(void **)&(this->super_IMeshLoader).field_0x10;
          }
          *(long *)&(this->super_IMeshLoader).field_0x10 = (long)pvVar13 + -0x10;
        }
        lVar11 = *(long *)&(this->super_IMeshLoader).field_0x10;
        iVar9 = *(int *)(lVar11 + -0xc);
        lVar11 = *(long *)(lVar11 + -8);
        iVar10 = (*this->B3DFile->_vptr_IReadFile[3])();
      } while (CONCAT44(extraout_var_02,iVar10) < iVar9 + lVar11);
    }
    pvVar13 = *(void **)&(this->super_IMeshLoader).field_0x8;
    lVar11 = *(long *)&(this->super_IMeshLoader).field_0x18;
    *(undefined8 *)this_00 = 0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x10 = 0;
    *(undefined8 *)&(this->super_IMeshLoader).field_0x18 = 0;
    if (pvVar13 != (void *)0x0) {
      operator_delete(pvVar13,lVar11 - (long)pvVar13);
    }
    this->field_0x20 = 1;
    pSVar3 = (this->BaseVertices).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (this->BaseVertices).m_data.
             super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->BaseVertices).m_data.
    super__Vector_base<irr::video::S3DVertex2TCoords,_std::allocator<irr::video::S3DVertex2TCoords>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pSVar3 != (pointer)0x0) {
      operator_delete(pSVar3,(long)pSVar4 - (long)pSVar3);
    }
    (this->BaseVertices).is_sorted = true;
    piVar5 = (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->AnimatedVertices_VertexID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar5 != (pointer)0x0) {
      operator_delete(piVar5,(long)piVar6 - (long)piVar5);
    }
    (this->AnimatedVertices_VertexID).is_sorted = true;
    piVar5 = (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->AnimatedVertices_BufferID).m_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (piVar5 != (pointer)0x0) {
      operator_delete(piVar5,(long)piVar6 - (long)piVar5);
    }
    bVar8 = true;
    (this->AnimatedVertices_BufferID).is_sorted = true;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->Materials).m_data.
         super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Materials).m_data.
    super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::vector<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>::~vector
              (&local_58);
    (this->Materials).is_sorted = true;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_58.super__Vector_base<irr::scene::SB3dMaterial,_std::allocator<irr::scene::SB3dMaterial>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)(this->Textures).m_data.
                  super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->Textures).m_data.
    super__Vector_base<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    ::std::vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_>::~vector
              ((vector<irr::scene::SB3dTexture,_std::allocator<irr::scene::SB3dTexture>_> *)
               &local_58);
    (this->Textures).is_sorted = true;
  }
  else {
    (*this->B3DFile->_vptr_IReadFile[4])();
    os::Printer::log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool CB3DMeshFileLoader::load()
{
	B3dStack.clear();

	NormalsInFile = false;
	HasVertexColors = false;

	//------ Get header ------

	SB3dChunkHeader header;
	B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
	header.size = os::Byteswap::byteswap(header.size);
#endif

	if (strncmp(header.name, "BB3D", 4) != 0) {
		os::Printer::log("File is not a b3d file. Loading failed (No header found)", B3DFile->getFileName(), ELL_ERROR);
		return false;
	}

	// Add main chunk...
	B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

	// Get file version, but ignore it, as it's not important with b3d files...
	s32 fileVersion;
	B3DFile->read(&fileVersion, sizeof(fileVersion));
#ifdef __BIG_ENDIAN__
	fileVersion = os::Byteswap::byteswap(fileVersion);
#endif

	//------ Read main chunk ------

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) {
		B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
		header.size = os::Byteswap::byteswap(header.size);
#endif
		B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

		if (strncmp(B3dStack.getLast().name, "TEXS", 4) == 0) {
			if (!readChunkTEXS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "BRUS", 4) == 0) {
			if (!readChunkBRUS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "NODE", 4) == 0) {
			if (!readChunkNODE((CSkinnedMesh::SJoint *)0))
				return false;
		} else {
			os::Printer::log("Unknown chunk found in mesh base - skipping");
			if (!B3DFile->seek(B3dStack.getLast().startposition + B3dStack.getLast().length))
				return false;
			B3dStack.erase(B3dStack.size() - 1);
		}
	}

	B3dStack.clear();

	BaseVertices.clear();
	AnimatedVertices_VertexID.clear();
	AnimatedVertices_BufferID.clear();

	Materials.clear();
	Textures.clear();

	return true;
}